

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_json_check(JSContext *ctx,JSONStringifyContext *jsc,JSValue holder,JSValue val,
                     JSValue key)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  JSRefCountHeader *p_1;
  JSValueUnion JVar5;
  ulong uVar6;
  ulong uVar7;
  JSRefCountHeader *p;
  int64_t iVar8;
  char cVar9;
  JSValue JVar10;
  JSValue JVar11;
  JSValue JVar12;
  uint uStack_64;
  JSValueUnion local_58;
  int64_t iStack_50;
  JSValue local_48;
  
  if ((int)val.tag == -1) {
    JVar10 = JS_GetPropertyInternal(ctx,val,0x8e,val,0);
    JVar5 = JVar10.u;
    JVar11 = val;
    if ((JVar10.tag & 0xffffffffU) != 6) {
      if ((uint)JVar10.tag == 0xffffffff) {
        uVar1 = *(ushort *)((long)JVar5.ptr + 6);
        if (uVar1 != 0xd) {
          if (uVar1 == 0x29) {
            cVar9 = *(char *)(*(long *)((long)JVar5.ptr + 0x30) + 0x20);
          }
          else {
            cVar9 = ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0;
          }
          if (cVar9 == '\0') goto LAB_0012ccd4;
        }
        JVar11 = JS_CallFree(ctx,JVar10,val,1,&key);
        iVar2 = *val.u.ptr;
        *(int *)val.u.ptr = iVar2 + -1;
        if (iVar2 < 2) {
          __JS_FreeValueRT(ctx->rt,val);
        }
        val = JVar11;
        if ((int)JVar11.tag == 6) goto LAB_0012cd93;
      }
      else {
LAB_0012ccd4:
        if ((0xfffffff4 < (uint)JVar10.tag) &&
           (iVar2 = *JVar5.ptr, *(int *)JVar5.ptr = iVar2 + -1, iVar2 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar10);
        }
      }
      goto LAB_0012cd01;
    }
LAB_0012cd93:
    if ((0xfffffff4 < (uint)JVar11.tag) &&
       (iVar2 = *JVar11.u.ptr, *(int *)JVar11.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar11);
    }
    uVar6 = 0;
    uVar7 = 0;
    iVar8 = 6;
    goto LAB_0012cde5;
  }
LAB_0012cd01:
  iVar8 = (jsc->replacer_func).tag;
  if ((int)iVar8 != 3) {
    local_58 = key.u;
    iStack_50 = key.tag;
    JVar11.tag = 3;
    JVar11.u.ptr = (void *)((ulong)uStack_64 << 0x20);
    JVar10.tag = iVar8;
    JVar10.u.ptr = (jsc->replacer_func).u.ptr;
    local_48 = val;
    JVar11 = JS_CallInternal(ctx,JVar10,holder,JVar11,2,(JSValue *)&local_58,2);
    if ((0xfffffff4 < (uint)val.tag) &&
       (iVar2 = *val.u.ptr, *(int *)val.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,val);
    }
    val = JVar11;
    if ((int)JVar11.tag == 6) goto LAB_0012cd93;
  }
  iVar8 = val.tag;
  JVar5 = val.u;
  uVar3 = (uint)val.tag;
  uVar4 = uVar3 + 7;
  if (uVar4 < 0xf) {
    if ((0x6381U >> (uVar4 & 0x1f) & 1) != 0) {
LAB_0012cdd5:
      uVar7 = (ulong)JVar5.ptr & 0xffffffff00000000;
      uVar6 = (ulong)JVar5.ptr & 0xffffffff;
      goto LAB_0012cde5;
    }
    if (uVar4 != 6) goto LAB_0012ce1e;
    if (uVar3 != 0xffffffff) goto LAB_0012cdd5;
    uVar1 = *(ushort *)((long)JVar5.ptr + 6);
    if (uVar1 != 0xd) {
      if (uVar1 == 0x29) {
        cVar9 = *(char *)(*(long *)((long)JVar5.ptr + 0x30) + 0x20);
      }
      else {
        cVar9 = ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0;
      }
      if (cVar9 == '\0') goto LAB_0012cdd5;
    }
  }
  else {
LAB_0012ce1e:
    if (uVar3 < 0xfffffff5) {
      iVar8 = 3;
      uVar6 = 0;
      uVar7 = 0;
      goto LAB_0012cde5;
    }
  }
  iVar2 = *JVar5.ptr;
  *(int *)JVar5.ptr = iVar2 + -1;
  if (iVar2 < 2) {
    __JS_FreeValueRT(ctx->rt,val);
  }
  uVar6 = 0;
  uVar7 = 0;
  iVar8 = 3;
LAB_0012cde5:
  JVar12.u.ptr = (void *)(uVar6 | uVar7);
  JVar12.tag = iVar8;
  return JVar12;
}

Assistant:

static JSValue js_json_check(JSContext *ctx, JSONStringifyContext *jsc,
                             JSValueConst holder, JSValue val, JSValueConst key)
{
    JSValue v;
    JSValueConst args[2];

    if (JS_IsObject(val)
#ifdef CONFIG_BIGNUM
    ||  JS_IsBigInt(ctx, val)   /* XXX: probably useless */
#endif
        ) {
            JSValue f = JS_GetProperty(ctx, val, JS_ATOM_toJSON);
            if (JS_IsException(f))
                goto exception;
            if (JS_IsFunction(ctx, f)) {
                v = JS_CallFree(ctx, f, val, 1, &key);
                JS_FreeValue(ctx, val);
                val = v;
                if (JS_IsException(val))
                    goto exception;
            } else {
                JS_FreeValue(ctx, f);
            }
        }

    if (!JS_IsUndefined(jsc->replacer_func)) {
        args[0] = key;
        args[1] = val;
        v = JS_Call(ctx, jsc->replacer_func, holder, 2, args);
        JS_FreeValue(ctx, val);
        val = v;
        if (JS_IsException(val))
            goto exception;
    }

    switch (JS_VALUE_GET_NORM_TAG(val)) {
    case JS_TAG_OBJECT:
        if (JS_IsFunction(ctx, val))
            break;
    case JS_TAG_STRING:
    case JS_TAG_INT:
    case JS_TAG_FLOAT64:
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
#endif
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
#endif
    case JS_TAG_EXCEPTION:
        return val;
    default:
        break;
    }
    JS_FreeValue(ctx, val);
    return JS_UNDEFINED;

exception:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}